

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O1

Vector __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getMomentaDotFromKinematics
          (ModelBaseEKFFlexEstimatorIMU *this)

{
  Vector *u;
  _func_int **pp_Var1;
  undefined8 *puVar2;
  Index in_RDX;
  Index extraout_RDX;
  Index extraout_RDX_00;
  ActualDstType actualDst;
  long *in_RSI;
  Vector VVar3;
  void *local_38 [2];
  
  if ((char)in_RSI[0x2d0] == '\x01') {
    u = (Vector *)(**(code **)(*in_RSI + 0x80))();
    (**(code **)(*in_RSI + 0x70))(local_38);
    IMUElasticLocalFrameDynamicalSystem::getMomentaDotFromKinematics
              ((IMUElasticLocalFrameDynamicalSystem *)this,(Vector *)(in_RSI + 0x6c),u);
    free(local_38[0]);
    in_RDX = extraout_RDX;
  }
  else {
    (this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
    _vptr_FlexibilityEstimatorBase = (_func_int **)0x0;
    (this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase.super_ZeroDelayObserver.
    super_ObserverBase._vptr_ObserverBase = (_func_int **)0x0;
    if ((this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase.
        super_ZeroDelayObserver.super_ObserverBase._vptr_ObserverBase != (_func_int **)0x6) {
      free((this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
           _vptr_FlexibilityEstimatorBase);
      pp_Var1 = (_func_int **)malloc(0x30);
      if (((ulong)pp_Var1 & 0xf) != 0) {
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                      "void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (pp_Var1 == (_func_int **)0x0) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = operator_delete;
        __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      (this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
      _vptr_FlexibilityEstimatorBase = pp_Var1;
      in_RDX = extraout_RDX_00;
    }
    (this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase.super_ZeroDelayObserver.
    super_ObserverBase._vptr_ObserverBase = (_func_int **)0x6;
    pp_Var1 = (this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
              _vptr_FlexibilityEstimatorBase;
    pp_Var1[4] = (_func_int *)0x0;
    pp_Var1[5] = (_func_int *)0x0;
    pp_Var1[2] = (_func_int *)0x0;
    pp_Var1[3] = (_func_int *)0x0;
    *pp_Var1 = (_func_int *)0x0;
    pp_Var1[1] = (_func_int *)0x0;
  }
  VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = in_RDX;
  VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector ModelBaseEKFFlexEstimatorIMU::getMomentaDotFromKinematics()
{
  if(on_ == true)
  {
    return functor_.getMomentaDotFromKinematics(getFlexibilityVector(), getInput());
  }
  else
  {
    Vector6 v;
    v.setZero();
    return v;
  }
}